

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O3

void __thiscall
cfd::ConfidentialTransactionContext::Verify(ConfidentialTransactionContext *this,OutPoint *outpoint)

{
  pointer pOVar1;
  bool bVar2;
  uint uVar3;
  CfdException *this_00;
  OutPoint *target;
  pointer object;
  UtxoData utxo;
  function<cfd::core::ByteData256_(const_cfd::ConfidentialTransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
  local_558;
  string local_538;
  UtxoData local_518;
  
  UtxoData::UtxoData(&local_518);
  bVar2 = IsFindUtxoMap(this,outpoint,&local_518);
  if (!bVar2) {
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_538,"Utxo is not found. verify fail.","");
    core::CfdException::CfdException(this_00,kCfdIllegalStateError,&local_538);
    __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  uVar3 = (*(this->super_ConfidentialTransaction).super_AbstractTransaction.
            _vptr_AbstractTransaction[0xf])(this,outpoint);
  local_558.super__Function_base._M_functor._8_8_ = 0;
  local_558.super__Function_base._M_functor._M_unused._M_object = CreateConfidentialTxSighash;
  local_558._M_invoker =
       std::
       _Function_handler<cfd::core::ByteData256_(const_cfd::ConfidentialTransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*),_cfd::core::ByteData256_(*)(const_cfd::ConfidentialTransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
       ::_M_invoke;
  local_558.super__Function_base._M_manager =
       std::
       _Function_handler<cfd::core::ByteData256_(const_cfd::ConfidentialTransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*),_cfd::core::ByteData256_(*)(const_cfd::ConfidentialTransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
       ::_M_manager;
  TransactionContextUtil::Verify<cfd::ConfidentialTransactionContext>
            (this,outpoint,&local_518,
             &(this->super_ConfidentialTransaction).vin_.
              super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar3].super_AbstractTxIn,&local_558);
  if (local_558.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_558.super__Function_base._M_manager)
              ((_Any_data *)&local_558,(_Any_data *)&local_558,__destroy_functor);
  }
  pOVar1 = (this->verify_map_).
           super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (object = (this->verify_map_).
                super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>.
                _M_impl.super__Vector_impl_data._M_start; object != pOVar1; object = object + 1) {
    bVar2 = core::OutPoint::operator==(outpoint,object);
    if (bVar2) goto LAB_003c0bd7;
  }
  std::vector<cfd::core::OutPoint,std::allocator<cfd::core::OutPoint>>::
  emplace_back<cfd::core::OutPoint_const&>
            ((vector<cfd::core::OutPoint,std::allocator<cfd::core::OutPoint>> *)&this->verify_map_,
             outpoint);
LAB_003c0bd7:
  UtxoData::~UtxoData(&local_518);
  return;
}

Assistant:

void ConfidentialTransactionContext::Verify(const OutPoint& outpoint) {
  UtxoData utxo;
  if (!IsFindUtxoMap(outpoint, &utxo)) {
    throw CfdException(
        CfdError::kCfdIllegalStateError, "Utxo is not found. verify fail.");
  }
  const auto& txin = vin_[GetTxInIndex(outpoint)];

  TransactionContextUtil::Verify<ConfidentialTransactionContext>(
      this, outpoint, utxo, &txin, CreateConfidentialTxSighash);
  if (!IsFindOutPoint(verify_map_, outpoint)) {
    verify_map_.emplace_back(outpoint);
  }
}